

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::Contribute_v2
          (TPZDohrSubstruct<std::complex<long_double>_> *this,
          TPZFMatrix<std::complex<long_double>_> *v2)

{
  int64_t iVar1;
  pair<int,_int> *ppVar2;
  complex<long_double> *__y;
  complex<long_double> *in_RDI;
  pair<int,_int> ind;
  int neqs;
  int i;
  TPZDohrSubstruct<std::complex<long_double>_> *in_stack_00000350;
  int64_t in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  int local_20;
  int local_14;
  
  SolveSystemZi(in_stack_00000350);
  iVar1 = TPZVec<std::pair<int,_int>_>::NElements
                    ((TPZVec<std::pair<int,_int>_> *)(in_RDI[0x36]._M_value + 8));
  for (local_14 = 0; local_14 < (int)iVar1; local_14 = local_14 + 1) {
    ppVar2 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI[0x36]._M_value + 8),(long)local_14);
    local_20 = (*ppVar2).first;
    __y = TPZVec<std::complex<long_double>_>::operator[]
                    ((TPZVec<std::complex<long_double>_> *)(in_RDI[0x25]._M_value + 0x10),
                     (long)local_20);
    TPZFMatrix<std::complex<long_double>_>::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::operator*(in_RDI,__y);
    TPZFMatrix<std::complex<long_double>_>::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::complex<long_double>::operator+=(in_RDI,__y);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2(TPZFMatrix<TVar> &v2) {
	int i;
	SolveSystemZi();
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fzi(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		v2(ind.second,0) += fWeights[ind.first] * fzi(ind.first,0);
	}
}